

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  Action *pAVar1;
  undefined8 uVar2;
  Result RVar3;
  TokenType TVar4;
  pointer *__ptr;
  Var *pVVar5;
  long lVar6;
  unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> action;
  Location loc;
  undefined1 local_138 [32];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  Location local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  Var local_c0;
  Var local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_138,this);
  local_f8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_138._16_8_;
  local_f8.field_1._8_8_ = local_138._24_8_;
  local_f8.filename.data_ = (char *)local_138._0_8_;
  local_f8.filename.size_ = local_138._8_8_;
  TVar4 = Peek(this,0);
  if (TVar4 == Get) {
    Consume((Token *)local_138,this);
    MakeUnique<wabt::GetAction,wabt::Location&>((wabt *)local_138,&local_f8);
    pVVar5 = (Var *)(local_138._0_8_ + 0x28);
    Var::Var(&local_c0,this->last_module_index_,&local_f8);
    ParseVarOpt(this,pVVar5,&local_c0);
    Var::~Var(&local_c0);
    RVar3 = ParseQuotedText(this,(string *)(local_138._0_8_ + 0x70));
    uVar2 = local_138._0_8_;
    if (RVar3.enum_ != Error) {
      local_138._0_8_ = (Action *)0x0;
      pAVar1 = (out_action->_M_t).
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
      super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)uVar2;
      if (pAVar1 != (Action *)0x0) {
        (*pAVar1->_vptr_Action[1])();
      }
    }
    if ((Action *)local_138._0_8_ != (Action *)0x0) {
      (*(*(_func_int ***)local_138._0_8_)[1])();
    }
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    if (TVar4 != Invoke) {
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"invoke","");
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"get","");
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 local_138,&local_f8);
      lVar6 = 0;
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_d8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_d8);
      do {
        if (local_108 + lVar6 != *(undefined1 **)((long)local_118 + lVar6)) {
          operator_delete(*(undefined1 **)((long)local_118 + lVar6));
        }
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x40);
      return (Result)RVar3.enum_;
    }
    Consume((Token *)local_138,this);
    MakeUnique<wabt::InvokeAction,wabt::Location&>((wabt *)local_138,&local_f8);
    pVVar5 = (Var *)(local_138._0_8_ + 0x28);
    Var::Var(&local_78,this->last_module_index_,&local_f8);
    ParseVarOpt(this,pVVar5,&local_78);
    Var::~Var(&local_78);
    RVar3 = ParseQuotedText(this,(string *)(local_138._0_8_ + 0x70));
    if ((RVar3.enum_ == Error) ||
       (RVar3 = ParseConstList(this,(ConstVector *)(local_138._0_8_ + 0x98),Normal),
       uVar2 = local_138._0_8_, RVar3.enum_ == Error)) {
      if ((Action *)local_138._0_8_ != (Action *)0x0) {
        (*(*(_func_int ***)local_138._0_8_)[1])();
      }
      return (Result)Error;
    }
    local_138._0_8_ = (Action *)0x0;
    pAVar1 = (out_action->_M_t).
             super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
             super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
    (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
    super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)uVar2;
    if (pAVar1 != (Action *)0x0) {
      (*pAVar1->_vptr_Action[1])();
    }
    if ((Action *)local_138._0_8_ != (Action *)0x0) {
      (*(*(_func_int ***)local_138._0_8_)[1])();
    }
  }
  RVar3 = Expect(this,Rpar);
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = MakeUnique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args, ConstType::Normal));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = MakeUnique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}